

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellBST::AddLayer
          (ChElementShellBST *this,double thickness,double theta,
          shared_ptr<chrono::fea::ChMaterialShellKirchhoff> *material)

{
  shared_ptr<chrono::fea::ChMaterialShellKirchhoff> local_40;
  Layer local_30;
  
  local_40.super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (material->
           super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_40.super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (material->
       super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_40.super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.
       super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.
       super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Layer::Layer(&local_30,this,thickness,theta,&local_40);
  std::
  vector<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
  ::emplace_back<chrono::fea::ChElementShellBST::Layer>(&this->m_layers,&local_30);
  if (local_30.m_material.
      super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.m_material.
               super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_40.super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  SetLayerZreferenceCentered(this);
  return;
}

Assistant:

void ChElementShellBST::AddLayer(double thickness,
                                       double theta,
                                       std::shared_ptr<ChMaterialShellKirchhoff> material) {
    m_layers.push_back(Layer(this, thickness, theta, material));
    SetLayerZreferenceCentered();
}